

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint128_t farmhashcc::Fingerprint128(char *s,size_t len)

{
  unsigned_long in_R8;
  uint128_t uVar1;
  uint128_t seed;
  
  if (0xf < len) {
    seed.first = *(long *)(s + 8) + 0xc3a5c85c97cb3127;
    seed.second = in_R8;
    uVar1 = CityHash128WithSeed((farmhashcc *)(s + 0x10),(char *)(len - 0x10),*(size_t *)s,seed);
    return uVar1;
  }
  uVar1.second = in_R8;
  uVar1.first = 0xb492b66fbe98f273;
  uVar1 = CityHash128WithSeed((farmhashcc *)s,(char *)len,0xc3a5c85c97cb3127,uVar1);
  return uVar1;
}

Assistant:

uint128_t Fingerprint128(const char* s, size_t len) {
  return CityHash128(s, len);
}